

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

void __thiscall flow::lang::IRGenerator::codegenInline(IRGenerator *this,HandlerSym *handlerSym)

{
  Report *pRVar1;
  SymbolTable *pSVar2;
  pointer puVar3;
  __uniq_ptr_data<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>,_true,_true> _Var4;
  Stmt *stmt;
  unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *symbol;
  pointer puVar5;
  _Deque_iterator<flow::lang::HandlerSym_*,_flow::lang::HandlerSym_*&,_flow::lang::HandlerSym_**> i;
  allocator<char> local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Deque_iterator<flow::lang::HandlerSym_*,_flow::lang::HandlerSym_*&,_flow::lang::HandlerSym_**>
  local_88;
  _Deque_iterator<flow::lang::HandlerSym_*,_flow::lang::HandlerSym_*&,_flow::lang::HandlerSym_**>
  local_68;
  _Deque_iterator<flow::lang::HandlerSym_*,_flow::lang::HandlerSym_*&,_flow::lang::HandlerSym_**>
  local_48;
  
  local_68._M_cur =
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_68._M_first =
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_first;
  local_68._M_last =
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_last;
  local_68._M_node =
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_node;
  local_88._M_cur =
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_88._M_first =
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_first;
  local_88._M_last =
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_last;
  local_88._M_node =
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  local_e8._M_dataplus._M_p = (pointer)handlerSym;
  std::
  find<std::_Deque_iterator<flow::lang::HandlerSym*,flow::lang::HandlerSym*&,flow::lang::HandlerSym**>,flow::lang::HandlerSym*>
            (&local_48,&local_68,&local_88,(HandlerSym **)&local_e8);
  if (local_48._M_cur ==
      (this->handlerStack_).
      super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>._M_impl
      .super__Deque_impl_data._M_finish._M_cur) {
    local_e8._M_dataplus._M_p = (pointer)handlerSym;
    std::deque<flow::lang::HandlerSym*,std::allocator<flow::lang::HandlerSym*>>::
    emplace_back<flow::lang::HandlerSym*>
              ((deque<flow::lang::HandlerSym*,std::allocator<flow::lang::HandlerSym*>> *)
               &this->handlerStack_,(HandlerSym **)&local_e8);
    pSVar2 = (handlerSym->scope_)._M_t.
             super___uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>
             ._M_t.
             super__Tuple_impl<0UL,_flow::lang::SymbolTable_*,_std::default_delete<flow::lang::SymbolTable>_>
             .super__Head_base<0UL,_flow::lang::SymbolTable_*,_false>._M_head_impl;
    if (pSVar2 != (SymbolTable *)0x0) {
      puVar3 = *(pointer *)
                ((long)&(pSVar2->symbols_).
                        super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                + 8);
      for (puVar5 = *(pointer *)
                     &(pSVar2->symbols_).
                      super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
          ; puVar5 != puVar3; puVar5 = puVar5 + 1) {
        _Var4.super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>.
        _M_t.super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
        super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl =
             (puVar5->_M_t).
             super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>;
        (**(code **)(*(long *)_Var4.
                              super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>
                              .super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl +
                    0x10))(_Var4.
                           super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>
                           .super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl,this);
      }
    }
    stmt = (handlerSym->body_)._M_t.
           super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
           super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    if (stmt == (Stmt *)0x0) {
      pRVar1 = this->report_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Forward declared handler \'{}\' is missing implementation.",
                 &local_e9);
      std::__cxx11::string::string
                ((string *)&local_c8,(string *)&(handlerSym->super_CallableSym).super_Symbol.name_);
      diagnostics::Report::typeError<std::__cxx11::string>
                (pRVar1,&(handlerSym->super_CallableSym).super_Symbol.super_ASTNode.location_,
                 &local_e8,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      stmt = (handlerSym->body_)._M_t.
             super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
             super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    }
    codegen(this,stmt);
    std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::pop_back
              (&this->handlerStack_);
  }
  else {
    pRVar1 = this->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Cannot recursively call handler {}.",&local_e9);
    std::__cxx11::string::string
              ((string *)&local_a8,(string *)&(handlerSym->super_CallableSym).super_Symbol.name_);
    diagnostics::Report::typeError<std::__cxx11::string>
              (pRVar1,&(handlerSym->super_CallableSym).super_Symbol.super_ASTNode.location_,
               &local_e8,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return;
}

Assistant:

void IRGenerator::codegenInline(HandlerSym& handlerSym) {
  auto i = std::find(handlerStack_.begin(), handlerStack_.end(), &handlerSym);
  if (i != handlerStack_.end()) {
    report_->typeError(handlerSym.location(),
                       "Cannot recursively call handler {}.", handlerSym.name());

    return;
  }

  handlerStack_.push_back(&handlerSym);

  // emit local variable declarations
  if (handlerSym.scope()) {
    for (std::unique_ptr<Symbol>& symbol : *handlerSym.scope()) {
      codegen(symbol.get());
    }
  }

  if (handlerSym.body() == nullptr) {
    report_->typeError(handlerSym.location(),
                       "Forward declared handler '{}' is missing implementation.",
                       handlerSym.name());
  }

  // emit body
  codegen(handlerSym.body());

  handlerStack_.pop_back();
}